

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_row_access_constructors<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>_>_>
                *matrix,vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                        *rows)

{
  uint uVar1;
  int iVar2;
  pointer plVar3;
  node_ptr plVar4;
  Index IVar5;
  Dimension DVar6;
  node_ptr prVar7;
  bool bVar8;
  node_ptr prVar9;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *r;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *r_1;
  node_ptr plVar10;
  undefined4 local_2b4;
  undefined *local_2b0;
  undefined4 *local_2a8;
  undefined **local_2a0;
  undefined **local_298;
  char *local_290;
  shared_count sStack_288;
  char *local_280;
  node_disposer<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5>
  local_278;
  undefined8 *local_268;
  undefined ***local_260;
  undefined **local_258;
  ulong local_250;
  shared_count sStack_248;
  undefined4 **local_240;
  char *local_238;
  char *local_230;
  shared_count sStack_228;
  undefined1 local_220 [16];
  undefined1 local_210 [24];
  node_ptr local_1f8;
  _Base_ptr p_Stack_1f0;
  _Base_ptr p_Stack_1e8;
  undefined8 local_1d8;
  Entry_constructor *pEStack_1d0;
  undefined1 local_1c8 [24];
  node_ptr local_1b0;
  undefined8 uStack_1a8;
  rbtree_node<void_*> local_1a0;
  vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  *local_180;
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>_>_>
  *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1c8,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_210,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1c8);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_1c8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_210);
  build_column_values<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1c8,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_210,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1c8);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_1c8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_210);
  local_178 = matrix;
  Gudhi::persistence_matrix::
  Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>
  ::
  Intrusive_set_column<std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
            ((Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>
              *)local_210,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  plVar3 = (rows->
           super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_180 = rows;
  IVar5 = local_210._0_4_;
  DVar6 = local_210._16_4_;
  prVar7 = local_1f8;
  for (plVar10 = (node_ptr)
                 (rows->
                 super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; plVar10 != (node_ptr)plVar3;
      plVar10 = plVar10 + 1) {
    plVar4 = (((type *)&plVar10->next_)->data_).root_plus_size_.m_header.super_node.next_;
    local_210._0_4_ = IVar5;
    local_210._16_4_ = DVar6;
    local_1f8 = prVar7;
    if (plVar10 != plVar4 && plVar4 != (node_ptr)0x0) {
      plVar4 = plVar10->prev_;
      uVar1 = *(uint *)&plVar4[3].next_;
      if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        local_130 = &boost::unit_test::basic_cstring<char_const>::null;
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x215);
        local_250 = local_250 & 0xffffffffffffff00;
        local_258 = &PTR__lazy_ostream_0022e440;
        sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_240 = (undefined4 **)0x1ec196;
        iVar2 = *(int *)&plVar4[-1].prev_;
        local_2a8 = (undefined4 *)CONCAT44(local_2a8._4_4_,iVar2);
        local_2b0 = (undefined *)CONCAT44(local_2b0._4_4_,6);
        local_298 = (undefined **)CONCAT71(local_298._1_7_,iVar2 == 6);
        local_290 = (char *)0x0;
        sStack_288.pi_ = (sp_counted_base *)0x0;
        local_238 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_230 = "";
        local_220._0_8_ = &local_2a8;
        local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
        local_1c8._0_8_ = &PTR__lazy_ostream_0022e940;
        local_1c8._16_8_ = &boost::unit_test::lazy_ostream::inst;
        local_1b0 = (node_ptr)local_220;
        local_2a0 = &local_2b0;
        local_278.traits_ =
             (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
              *)((ulong)local_278.traits_ & 0xffffffffffffff00);
        local_278.
        super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
        .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0022e6c0;
        local_268 = &boost::unit_test::lazy_ostream::inst;
        local_260 = &local_2a0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_298,&local_258,&local_238,0x215,1,2,2,"entry.get_column_index()",local_1c8
                   ,"6",&local_278);
        boost::detail::shared_count::~shared_count(&sStack_288);
      }
    }
    IVar5 = local_210._0_4_;
    DVar6 = local_210._16_4_;
    prVar7 = local_1f8;
  }
  local_210._0_4_ = 0;
  local_1c8._4_4_ = (undefined4)((ulong)local_1c8._0_8_ >> 0x20);
  local_1c8._0_4_ = IVar5;
  local_210._16_4_ = -1;
  local_1c8._20_4_ = (undefined4)((ulong)local_1c8._16_8_ >> 0x20);
  local_1c8._16_4_ = DVar6;
  local_1a0.left_._4_4_ = 0;
  local_1a0.left_._0_4_ = red_t;
  local_1f8 = (node_ptr)0x0;
  prVar9 = prVar7;
  uStack_1a8 = (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                *)CONCAT44(p_Stack_1f0._4_4_,(_Rb_tree_color)p_Stack_1f0);
  if (prVar7 == (node_ptr)0x0) {
    prVar9 = &local_1a0;
    uStack_1a8 = (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                  *)&local_1b0;
  }
  p_Stack_1f0 = (_Base_ptr)&local_1f8;
  prVar9->parent_ = (node_ptr)&local_1b0;
  local_1a0.right_._0_4_ = (undefined4)local_1d8;
  local_1d8._4_4_ = (undefined4)((ulong)local_1d8 >> 0x20);
  local_1a0.right_._4_4_ = local_1d8._4_4_;
  local_1a0.color_ = (color)pEStack_1d0;
  pEStack_1d0._4_4_ = (undefined4)((ulong)pEStack_1d0 >> 0x20);
  local_1a0._28_4_ = pEStack_1d0._4_4_;
  local_1d8 = (_Base_ptr)0x0;
  pEStack_1d0 = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = prVar7;
  p_Stack_1e8 = p_Stack_1f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_290 = (char *)((ulong)local_290 & 0xffffffffffffff00);
  local_298 = &PTR__lazy_ostream_0022e440;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = "";
  local_278.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)(Delete_disposer)&local_1b0;
  local_2b0 = (undefined *)
              boost::intrusive::
              bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::size
                        ((const_node_ptr *)&local_278);
  local_2a0 = &local_2b0;
  local_2a8 = &local_2b4;
  local_2b4 = 4;
  local_230 = (char *)0x0;
  sStack_228.pi_ = (sp_counted_base *)0x0;
  local_220._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_220._8_8_ = "";
  local_260 = &local_2a0;
  local_278.traits_ =
       (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
        *)((ulong)local_278.traits_ & 0xffffffffffffff00);
  local_278.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0022e400;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_240 = &local_2a8;
  local_250 = local_250 & 0xffffffffffffff00;
  local_258 = &PTR__lazy_ostream_0022e6c0;
  sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_238._0_1_ = local_2b0 == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion
            (&local_238,&local_298,local_220,0x21c,1,2,2,"moveCol.size()",&local_278,"4",&local_258)
  ;
  boost::detail::shared_count::~shared_count(&sStack_228);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_278.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&local_1f8;
  local_290 = (char *)((ulong)local_290 & 0xffffffffffffff00);
  local_298 = &PTR__lazy_ostream_0022e440;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = "";
  local_2b0 = (undefined *)
              boost::intrusive::
              bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::size
                        ((const_node_ptr *)&local_278);
  local_2b4 = 0;
  local_238 = (char *)CONCAT71(local_238._1_7_,local_2b0 == (undefined *)0x0);
  local_230 = (char *)0x0;
  sStack_228.pi_ = (sp_counted_base *)0x0;
  local_220._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_220._8_8_ = "";
  local_2a0 = &local_2b0;
  local_278.traits_ =
       (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
        *)((ulong)local_278.traits_ & 0xffffffffffffff00);
  local_278.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0022e400;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_260 = &local_2a0;
  local_2a8 = &local_2b4;
  local_250 = local_250 & 0xffffffffffffff00;
  local_258 = &PTR__lazy_ostream_0022e6c0;
  sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_240 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_238,&local_298,local_220,0x21d,1,2,2,"col.size()",&local_278,"0",&local_258);
  boost::detail::shared_count::~shared_count(&sStack_228);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar8 = Gudhi::persistence_matrix::operator==
                    ((local_178->
                     super__Vector_base<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                      *)local_1c8);
  local_258 = (undefined **)CONCAT71(local_258._1_7_,bVar8);
  local_250 = 0;
  sStack_248.pi_ = (sp_counted_base *)0x0;
  local_298 = (undefined **)0x1f712c;
  local_290 = "";
  local_278.traits_ =
       (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
        *)((ulong)local_278.traits_ & 0xffffffffffffff00);
  local_278.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0022e388;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_260 = &local_298;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_248);
  plVar3 = (local_180->
           super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (plVar10 = (node_ptr)
                 (local_180->
                 super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; plVar10 != (node_ptr)plVar3;
      plVar10 = plVar10 + 1) {
    plVar4 = (((type *)&plVar10->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar10 != plVar4 && plVar4 != (node_ptr)0x0) {
      plVar4 = plVar10->prev_;
      uVar1 = *(uint *)&plVar4[3].next_;
      if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x22d,
                   &local_150);
        local_290 = (char *)((ulong)local_290 & 0xffffffffffffff00);
        local_298 = &PTR__lazy_ostream_0022e440;
        sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_280 = "";
        iVar2 = *(int *)&plVar4[-1].prev_;
        local_2b0 = (undefined *)CONCAT44(local_2b0._4_4_,iVar2);
        local_2b4 = 6;
        local_238 = (char *)CONCAT71(local_238._1_7_,iVar2 == 6);
        local_230 = (char *)0x0;
        sStack_228.pi_ = (sp_counted_base *)0x0;
        local_220._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_220._8_8_ = "";
        local_2a0 = &local_2b0;
        local_278.traits_ =
             (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
              *)((ulong)local_278.traits_ & 0xffffffffffffff00);
        local_278.
        super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
        .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0022e940;
        local_268 = &boost::unit_test::lazy_ostream::inst;
        local_260 = &local_2a0;
        local_2a8 = &local_2b4;
        local_250 = local_250 & 0xffffffffffffff00;
        local_258 = &PTR__lazy_ostream_0022e6c0;
        sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_240 = &local_2a8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_238,&local_298,local_220,0x22d,1,2,2,"entry.get_column_index()",&local_278
                   ,"6",&local_258);
        boost::detail::shared_count::~shared_count(&sStack_228);
      }
    }
  }
  Gudhi::persistence_matrix::swap
            ((Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
              *)local_210,
             (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
              *)local_1c8);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_290 = (char *)((ulong)local_290 & 0xffffffffffffff00);
  local_298 = &PTR__lazy_ostream_0022e440;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = "";
  local_278.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ =
       (Delete_disposer)
       (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
        *)&local_1b0;
  local_2b0 = (undefined *)
              boost::intrusive::
              bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::size
                        ((const_node_ptr *)&local_278);
  local_2b4 = 0;
  local_230 = (char *)0x0;
  sStack_228.pi_ = (sp_counted_base *)0x0;
  local_220._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_220._8_8_ = "";
  local_2a0 = &local_2b0;
  local_278.traits_ =
       (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
        *)((ulong)local_278.traits_ & 0xffffffffffffff00);
  local_278.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0022e400;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_260 = &local_2a0;
  local_2a8 = &local_2b4;
  local_250 = local_250 & 0xffffffffffffff00;
  local_258 = &PTR__lazy_ostream_0022e6c0;
  sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_240 = &local_2a8;
  local_238._0_1_ = local_2b0 == (undefined *)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_238,&local_298,local_220,0x234,1,2,2,"moveCol.size()",&local_278,"0",&local_258)
  ;
  boost::detail::shared_count::~shared_count(&sStack_228);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_290 = (char *)((ulong)local_290 & 0xffffffffffffff00);
  local_298 = &PTR__lazy_ostream_0022e440;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = "";
  local_278.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ =
       (Delete_disposer)
       (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
        *)&local_1f8;
  local_2b0 = (undefined *)
              boost::intrusive::
              bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::size
                        ((const_node_ptr *)&local_278);
  local_2b4 = 4;
  local_238 = (char *)CONCAT71(local_238._1_7_,local_2b0 == (undefined *)0x4);
  local_230 = (char *)0x0;
  sStack_228.pi_ = (sp_counted_base *)0x0;
  local_220._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_220._8_8_ = "";
  local_2a0 = &local_2b0;
  local_278.traits_ =
       (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
        *)((ulong)local_278.traits_ & 0xffffffffffffff00);
  local_278.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0022e400;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_260 = &local_2a0;
  local_2a8 = &local_2b4;
  local_250 = local_250 & 0xffffffffffffff00;
  local_258 = &PTR__lazy_ostream_0022e6c0;
  sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_240 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_238,&local_298,local_220,0x235,1,2,2,"col.size()",&local_278,"4",&local_258);
  boost::detail::shared_count::~shared_count(&sStack_228);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar8 = Gudhi::persistence_matrix::operator==
                    ((local_178->
                     super__Vector_base<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                      *)local_210);
  local_258 = (undefined **)CONCAT71(local_258._1_7_,bVar8);
  local_250 = 0;
  sStack_248.pi_ = (sp_counted_base *)0x0;
  local_298 = (undefined **)0x1f7141;
  local_290 = "";
  local_278.traits_ =
       (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
        *)((ulong)local_278.traits_ & 0xffffffffffffff00);
  local_278.
  super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
  .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0022e388;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_260 = &local_298;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_248);
  plVar3 = (local_180->
           super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (plVar10 = (node_ptr)
                 (local_180->
                 super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; plVar10 != (node_ptr)plVar3;
      plVar10 = plVar10 + 1) {
    plVar4 = (((type *)&plVar10->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar10 != plVar4 && plVar4 != (node_ptr)0x0) {
      plVar4 = plVar10->prev_;
      uVar1 = *(uint *)&plVar4[3].next_;
      if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_170 = &boost::unit_test::basic_cstring<char_const>::null;
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x245,
                   &local_170);
        local_290 = (char *)((ulong)local_290 & 0xffffffffffffff00);
        local_298 = &PTR__lazy_ostream_0022e440;
        sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_280 = "";
        iVar2 = *(int *)&plVar4[-1].prev_;
        local_2b0 = (undefined *)CONCAT44(local_2b0._4_4_,iVar2);
        local_2b4 = 6;
        local_238 = (char *)CONCAT71(local_238._1_7_,iVar2 == 6);
        local_230 = (char *)0x0;
        sStack_228.pi_ = (sp_counted_base *)0x0;
        local_220._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_220._8_8_ = "";
        local_2a0 = &local_2b0;
        local_278.traits_ =
             (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
              *)((ulong)local_278.traits_ & 0xffffffffffffff00);
        local_278.
        super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
        .super_Delete_disposer.col_ = (Delete_disposer)&PTR__lazy_ostream_0022e940;
        local_268 = &boost::unit_test::lazy_ostream::inst;
        local_260 = &local_2a0;
        local_2a8 = &local_2b4;
        local_250 = local_250 & 0xffffffffffffff00;
        local_258 = &PTR__lazy_ostream_0022e6c0;
        sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_240 = &local_2a8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_238,&local_298,local_220,0x245,1,2,2,"entry.get_column_index()",&local_278
                   ,"6",&local_258);
        boost::detail::shared_count::~shared_count(&sStack_228);
      }
    }
  }
  if (local_1b0 != (node_ptr)0x0) {
    local_278.
    super_ebo_functor_holder<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_void,_false>
    .super_Delete_disposer.col_ = (Delete_disposer)local_1c8;
    local_278.traits_ =
         (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
          *)&local_1b0;
    boost::intrusive::bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,false>>::
    dispose_subtree<boost::intrusive::detail::node_disposer<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>::Delete_disposer,boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>::Matrix_column_tag,3u>,(boost::intrusive::algo_types)5>>
              (local_1b0,&local_278);
  }
  local_1a0.parent_._0_4_ = 0;
  local_1a0.parent_._4_4_ = 0;
  local_1a0.left_._0_4_ = red_t;
  local_1b0 = (node_ptr)0x0;
  uStack_1a8._0_4_ = 0;
  uStack_1a8._4_4_ = 0;
  if (local_1f8 != (node_ptr)0x0) {
    local_1c8._0_8_ = local_210;
    local_1c8._8_8_ =
         (bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>
          *)&local_1f8;
    boost::intrusive::bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,false>>::
    dispose_subtree<boost::intrusive::detail::node_disposer<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>::Delete_disposer,boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,boost::intrusive::rbtree_node_traits<void*,false>,(boost::intrusive::link_mode_type)1,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>::Matrix_column_tag,3u>,(boost::intrusive::algo_types)5>>
              (local_1f8,
               (node_disposer<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>::Delete_disposer,_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5>
                *)local_1c8);
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}